

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskablock.c
# Opt level: O2

mkv_timestamp_t MATROSKA_BlockGetFrameStart(matroska_block *Block,size_t FrameNum)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = 0x7fffffffffffffff;
  lVar5 = lVar4;
  if ((FrameNum < (Block->Durations)._Used >> 3) &&
     (lVar2 = MATROSKA_BlockTimestamp(Block), lVar2 != 0x7fffffffffffffff)) {
    for (sVar3 = 0;
        (lVar5 = lVar2, FrameNum != sVar3 &&
        (lVar1 = *(long *)((Block->Durations)._Begin + sVar3 * 8), lVar5 = lVar4,
        lVar1 != 0x7fffffffffffffff)); sVar3 = sVar3 + 1) {
      lVar2 = lVar2 + lVar1;
    }
  }
  return lVar5;
}

Assistant:

mkv_timestamp_t MATROSKA_BlockGetFrameStart(const matroska_block *Block, size_t FrameNum)
{
    if (FrameNum >= ARRAYCOUNT(Block->Durations,mkv_timestamp_t))
        return INVALID_TIMESTAMP_T;
    else
    {
        size_t i;
        mkv_timestamp_t Start = MATROSKA_BlockTimestamp((matroska_block*)Block);
        if (Start!=INVALID_TIMESTAMP_T)
        {
            for (i=0;i<FrameNum;++i)
            {
                if (ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i]==INVALID_TIMESTAMP_T)
                    return INVALID_TIMESTAMP_T;
                Start += ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i];
            }
        }
        return Start;
    }
}